

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall AActor::UnlinkFromWorld(AActor *this,FLinkContext *ctx)

{
  AActor **ppAVar1;
  AActor *pAVar2;
  FBlockNode **ppFVar3;
  FBlockNode *pFVar4;
  FBlockNode *pFVar5;
  uint uVar6;
  
  if (ctx != (FLinkContext *)0x0) {
    ctx->sector_list = (msecnode_t *)0x0;
  }
  uVar6 = (this->flags).Value;
  if (((uVar6 & 8) == 0) && (ppAVar1 = this->sprev, ppAVar1 != (AActor **)0x0)) {
    pAVar2 = this->snext;
    *ppAVar1 = pAVar2;
    if (pAVar2 != (AActor *)0x0) {
      pAVar2->sprev = ppAVar1;
    }
    this->snext = (AActor *)0x0;
    this->sprev = (AActor **)0xbeefcafe;
    if (ctx == (FLinkContext *)0x0) {
      P_DelSeclist(this->touching_sectorlist,0x1c0);
      P_DelSeclist(this->touching_rendersectors,0x1d0);
    }
    else {
      ctx->sector_list = this->touching_sectorlist;
      ctx->render_list = this->touching_rendersectors;
    }
    this->touching_sectorlist = (msecnode_t *)0x0;
    this->touching_rendersectors = (msecnode_t *)0x0;
    uVar6 = (this->flags).Value;
  }
  if ((uVar6 & 0x10) == 0) {
    pFVar4 = this->BlockNode;
    while (pFVar5 = pFVar4, pFVar5 != (FBlockNode *)0x0) {
      ppFVar3 = pFVar5->PrevActor;
      pFVar4 = pFVar5->NextActor;
      if (pFVar4 != (FBlockNode *)0x0) {
        pFVar4->PrevActor = ppFVar3;
      }
      *ppFVar3 = pFVar4;
      pFVar4 = pFVar5->NextBlock;
      pFVar5->NextBlock = FBlockNode::FreeBlocks;
      FBlockNode::FreeBlocks = pFVar5;
    }
    this->BlockNode = (FBlockNode *)0x0;
  }
  return;
}

Assistant:

void AActor::UnlinkFromWorld (FLinkContext *ctx)
{
	if (ctx != nullptr) ctx->sector_list = nullptr;
	if (!(flags & MF_NOSECTOR))
	{
		// invisible things don't need to be in sector list
		// unlink from subsector

		// killough 8/11/98: simpler scheme using pointers-to-pointers for prev
		// pointers, allows head node pointers to be treated like everything else
		AActor **prev = sprev;
		AActor  *next = snext;

		if (prev != NULL)	// prev will be NULL if this actor gets deleted due to cleaning up from a broken savegame
		{
			if ((*prev = next))  // unlink from sector list
				next->sprev = prev;
			snext = NULL;
			sprev = (AActor **)(size_t)0xBeefCafe;	// Woo! Bug-catching value!

			// phares 3/14/98
			//
			// Save the sector list pointed to by touching_sectorlist.
			// In P_SetThingPosition, we'll keep any nodes that represent
			// sectors the Thing still touches. We'll add new ones then, and
			// delete any nodes for sectors the Thing has vacated. Then we'll
			// put it back into touching_sectorlist. It's done this way to
			// avoid a lot of deleting/creating for nodes, when most of the
			// time you just get back what you deleted anyway.

			if (ctx != nullptr)
			{
				ctx->sector_list = touching_sectorlist;
				ctx->render_list = touching_rendersectors;
			}
			else
			{
				P_DelSeclist(touching_sectorlist, &sector_t::touching_thinglist);
				P_DelSeclist(touching_rendersectors, &sector_t::touching_renderthings);
			}
			touching_sectorlist = nullptr; //to be restored by P_SetThingPosition
			touching_rendersectors = nullptr;
		}
	}
		
	if (!(flags & MF_NOBLOCKMAP))
	{
		// [RH] Unlink from all blocks this actor uses
		FBlockNode *block = this->BlockNode;

		while (block != NULL)
		{
			if (block->NextActor != NULL)
			{
				block->NextActor->PrevActor = block->PrevActor;
			}
			*(block->PrevActor) = block->NextActor;
			FBlockNode *next = block->NextBlock;
			block->Release ();
			block = next;
		}
		BlockNode = NULL;
	}
}